

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<false,float,duckdb::DistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  const_reference pvVar2;
  ulong uVar3;
  idx_t iVar4;
  uint uVar5;
  idx_t iVar6;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  idx_t iVar10;
  bool bVar11;
  uchar **rhs_locations;
  SelectionVector *lhs_sel;
  float local_68;
  float local_64;
  data_ptr_t local_60;
  idx_t local_58;
  value_type local_50;
  ulong local_48;
  data_ptr_t local_40;
  SelectionVector *local_38;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  local_38 = (lhs_format->unified).sel;
  local_60 = (lhs_format->unified).data;
  local_40 = rhs_row_locations->data;
  pvVar2 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  local_48 = col_idx >> 3;
  local_50 = *pvVar2;
  local_58 = count;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar8 = 0;
      uVar9 = 0;
      do {
        uVar7 = uVar9;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)sel->sel_vector[uVar9];
        }
        uVar3 = uVar7;
        if (local_38->sel_vector != (sel_t *)0x0) {
          uVar3 = (ulong)local_38->sel_vector[uVar7];
        }
        local_68 = *(float *)(*(long *)(local_40 + uVar7 * 8) + local_50);
        if (((1 << ((byte)col_idx & 7) & (uint)*(byte *)(*(long *)(local_40 + uVar7 * 8) + local_48)
             ) == 0) ||
           (bVar11 = Equals::Operation<float>((float *)(local_60 + uVar3 * 4),&local_68),
           count = local_58, !bVar11)) {
          sel->sel_vector[iVar8] = (sel_t)uVar7;
          iVar8 = iVar8 + 1;
        }
        uVar9 = uVar9 + 1;
      } while (count != uVar9);
      return iVar8;
    }
  }
  else if (count != 0) {
    iVar10 = 0;
    iVar8 = 0;
    do {
      iVar6 = iVar8;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)sel->sel_vector[iVar8];
      }
      iVar4 = iVar6;
      if (local_38->sel_vector != (sel_t *)0x0) {
        iVar4 = (idx_t)local_38->sel_vector[iVar6];
      }
      puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        bVar11 = false;
      }
      else {
        bVar11 = (puVar1[iVar4 >> 6] >> (iVar4 & 0x3f) & 1) == 0;
      }
      uVar5 = (uint)*(byte *)(*(long *)(local_40 + iVar6 * 8) + local_48) & 1 << ((byte)col_idx & 7)
      ;
      local_64 = *(float *)(*(long *)(local_40 + iVar6 * 8) + local_50);
      if ((bVar11) || (uVar5 == 0)) {
        bVar11 = (bool)(bVar11 ^ uVar5 == 0);
      }
      else {
        bVar11 = Equals::Operation<float>((float *)(local_60 + iVar4 * 4),&local_64);
        bVar11 = !bVar11;
        count = local_58;
      }
      if (bVar11) {
        sel->sel_vector[iVar10] = (sel_t)iVar6;
        iVar10 = iVar10 + 1;
      }
      iVar8 = iVar8 + 1;
    } while (count != iVar8);
    return iVar10;
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}